

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

void Wlc_NtkSaveOneNode(Wlc_Ntk_t *p,Wlc_Obj_t *pWlcObj,Gia_Man_t *pGia,Vec_Mem_t *vTtMem)

{
  int nWords;
  int iVar1;
  int Lit;
  int iObj;
  uint uVar2;
  uint uVar3;
  word *pOut;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  nWords = vTtMem->nEntrySize;
  uVar4 = pWlcObj->End - pWlcObj->Beg;
  uVar5 = -uVar4;
  if (0 < (int)uVar4) {
    uVar5 = uVar4;
  }
  iVar1 = Vec_IntEntry(&p->vCopies,(int)(((long)pWlcObj - (long)p->pObjs) / 0x18));
  for (uVar4 = 0; uVar4 <= uVar5; uVar4 = uVar4 + 1) {
    Lit = Vec_IntEntry(&p->vBits,iVar1 + uVar4);
    iObj = Abc_Lit2Var(Lit);
    pOut = Wlc_ObjSim(pGia,iObj);
    uVar6 = (uint)*pOut & 1;
    if (uVar6 != 0) {
      Abc_TtNot(pOut,nWords);
    }
    uVar2 = Vec_MemHashInsert(vTtMem,pOut);
    if (uVar6 != 0) {
      Abc_TtNot(pOut,nWords);
    }
    uVar3 = Abc_LitIsCompl(Lit);
    printf("%2d(%d) ",(ulong)uVar2,(ulong)(uVar6 ^ uVar3));
    Extra_PrintHex(_stdout,(uint *)pOut,8);
    putchar(10);
  }
  putchar(10);
  return;
}

Assistant:

void Wlc_NtkSaveOneNode( Wlc_Ntk_t * p, Wlc_Obj_t * pWlcObj, Gia_Man_t * pGia, Vec_Mem_t * vTtMem )
{
    int k, Entry;
    int nWords = Vec_MemEntrySize(vTtMem);
    int nBits = Wlc_ObjRange(pWlcObj);
    int iFirst = Vec_IntEntry( &p->vCopies, Wlc_ObjId(p, pWlcObj) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLit = Vec_IntEntry( &p->vBits, iFirst + k );
        word * pInfoObj = Wlc_ObjSim( pGia, Abc_Lit2Var(iLit) );
        int fCompl = pInfoObj[0] & 1;
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        Entry = Vec_MemHashInsert( vTtMem, pInfoObj );
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        printf( "%2d(%d) ", Entry, fCompl ^ Abc_LitIsCompl(iLit) );
        Extra_PrintHex( stdout, (unsigned*)pInfoObj, 8 );
        printf( "\n" );
    }
    printf( "\n" );
}